

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

StkId tryfuncTM(lua_State *L,StkId func)

{
  StkId pSVar1;
  TValue *pTVar2;
  TValue *io1;
  TValue *io1_1;
  StkId local_20;
  
  if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
    tryfuncTM_cold_1();
    func = local_20;
  }
  pTVar2 = luaT_gettmbyobj(L,&func->val,TM_CALL);
  if ((pTVar2->tt_ & 0xf) == 0) {
    luaG_callerror(L,&func->val);
  }
  for (pSVar1 = (L->top).p; func < pSVar1; pSVar1 = pSVar1 + -1) {
    (pSVar1->val).value_ = pSVar1[-1].val.value_;
    (pSVar1->val).tt_ = *(lu_byte *)((long)pSVar1 - 8);
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  (func->val).value_ = pTVar2->value_;
  (func->val).tt_ = pTVar2->tt_;
  return func;
}

Assistant:

static StkId tryfuncTM (lua_State *L, StkId func) {
  const TValue *tm;
  StkId p;
  checkstackGCp(L, 1, func);  /* space for metamethod */
  tm = luaT_gettmbyobj(L, s2v(func), TM_CALL);  /* (after previous GC) */
  if (l_unlikely(ttisnil(tm)))
    luaG_callerror(L, s2v(func));  /* nothing to call */
  for (p = L->top.p; p > func; p--)  /* open space for metamethod */
    setobjs2s(L, p, p-1);
  L->top.p++;  /* stack space pre-allocated by the caller */
  setobj2s(L, func, tm);  /* metamethod is the new function to be called */
  return func;
}